

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O1

hash_func_t getHasher(string *s)

{
  int iVar1;
  code *pcVar2;
  vw_exception *this;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  iVar1 = std::__cxx11::string::compare((char *)s);
  if (iVar1 == 0) {
    pcVar2 = hashstring;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)s);
    if (iVar1 != 0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(&local_190,"Unknown hash function: ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_190,(s->_M_dataplus)._M_p,s->_M_string_length);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_primitives.cc"
                 ,0x36,&local_1c0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    pcVar2 = hashall;
  }
  return pcVar2;
}

Assistant:

hash_func_t getHasher(const std::string& s)
{
  if (s == "strings")
    return hashstring;
  else if (s == "all")
    return hashall;
  else
    THROW("Unknown hash function: " << s);
}